

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

void Llb_ManFlowCollectAndMarkCone(Aig_Man_t *p,Vec_Ptr_t *vStarts,Vec_Ptr_t *vCone)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vCone_local;
  Vec_Ptr_t *vStarts_local;
  Aig_Man_t *p_local;
  
  Vec_PtrClear(vCone);
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vStarts);
    if (iVar1 <= local_2c) {
      return;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(vStarts,local_2c);
    if (((*(ulong *)&pObj_00->field_0x18 >> 4 & 1) == 0) ||
       ((*(ulong *)&pObj_00->field_0x18 >> 5 & 1) != 0)) break;
    Llb_ManFlowCollectAndMarkCone_rec(p,pObj_00,vCone);
    local_2c = local_2c + 1;
  }
  __assert_fail("pObj->fMarkA && !pObj->fMarkB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                ,0x420,"void Llb_ManFlowCollectAndMarkCone(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Llb_ManFlowCollectAndMarkCone( Aig_Man_t * p, Vec_Ptr_t * vStarts, Vec_Ptr_t * vCone )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrClear( vCone );
    Vec_PtrForEachEntry( Aig_Obj_t *, vStarts, pObj, i )
    {
        assert( pObj->fMarkA && !pObj->fMarkB );
        Llb_ManFlowCollectAndMarkCone_rec( p, pObj, vCone );
    }
}